

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall QMenuBar::mousePressEvent(QMenuBar *this,QMouseEvent *e)

{
  bool bVar1;
  MouseButton MVar2;
  QMenuBarPrivate *this_00;
  QPoint this_01;
  QAction *pQVar3;
  ulong uVar4;
  QMenu *pQVar5;
  QSinglePointEvent *in_RSI;
  QAction *in_RDI;
  long in_FS_OFFSET;
  QMenu *menu;
  QMenuBarPrivate *d;
  QAction *action;
  QMenu *in_stack_ffffffffffffff88;
  QWidget *in_stack_ffffffffffffffa0;
  QMenuBarPrivate *pos;
  undefined1 in_stack_ffffffffffffffc8 [16];
  unkbyte10 Var6;
  QWidget *this_02;
  
  this_02 = *(QWidget **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMenuBar *)0x65d04f);
  MVar2 = QSinglePointEvent::button(in_RSI);
  if (MVar2 == LeftButton) {
    this_00->field_0x298 = this_00->field_0x298 & 0xfe | 1;
    pos = this_00;
    QSinglePointEvent::position((QSinglePointEvent *)0x65d093);
    this_01 = QPointF::toPoint((QPointF *)in_stack_ffffffffffffffa0);
    pQVar3 = QMenuBarPrivate::actionAt((QMenuBarPrivate *)this_01,in_stack_ffffffffffffffc8._0_8_);
    Var6 = in_stack_ffffffffffffffc8._6_10_;
    if (((pQVar3 == (QAction *)0x0) || (bVar1 = QMenuBarPrivate::isVisible(this_00,in_RDI), !bVar1))
       || (uVar4 = QAction::isEnabled(), (uVar4 & 1) == 0)) {
      QMenuBarPrivate::setCurrentAction
                ((QMenuBarPrivate *)((unkuint10)Var6 >> 0x10),(QAction *)this,
                 SUB101((unkuint10)Var6 >> 8,0),SUB101(Var6,0));
      bVar1 = QWhatsThis::inWhatsThisMode();
      if (bVar1) {
        QSinglePointEvent::globalPosition((QSinglePointEvent *)0x65d114);
        QPointF::toPoint((QPointF *)in_stack_ffffffffffffffa0);
        QWhatsThis::showText((QPoint *)pos,(QString *)this_01,in_stack_ffffffffffffffa0);
      }
    }
    else {
      bVar1 = ::operator==((QPointer<QAction> *)this_00,(QAction **)in_stack_ffffffffffffff88);
      if ((bVar1) && ((pos->field_0x2a0 & 1) != 0)) {
        pQVar5 = ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x65d191);
        if (pQVar5 != (QMenu *)0x0) {
          QPointer<QMenu>::operator=((QPointer<QMenu> *)this_00,in_stack_ffffffffffffff88);
          QWidget::setAttribute
                    (this_02,(WidgetAttribute)((ulong)pQVar3 >> 0x20),SUB81((ulong)pQVar3 >> 0x18,0)
                    );
          QWidget::hide((QWidget *)0x65d1d1);
        }
      }
      else {
        QMenuBarPrivate::setCurrentAction
                  ((QMenuBarPrivate *)((unkuint10)Var6 >> 0x10),(QAction *)this,
                   SUB101((unkuint10)Var6 >> 8,0),SUB101(Var6,0));
      }
    }
  }
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != this_02) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBar::mousePressEvent(QMouseEvent *e)
{
    Q_D(QMenuBar);
    if (e->button() != Qt::LeftButton)
        return;

    d->mouseDown = true;

    QAction *action = d->actionAt(e->position().toPoint());
    if (!action || !d->isVisible(action) || !action->isEnabled()) {
        d->setCurrentAction(nullptr);
#if QT_CONFIG(whatsthis)
        if (QWhatsThis::inWhatsThisMode())
            QWhatsThis::showText(e->globalPosition().toPoint(), d->whatsThis, this);
#endif
        return;
    }

    if (d->currentAction == action && d->popupState) {
        if (QMenu *menu = d->activeMenu) {
            d->activeMenu = nullptr;
            menu->setAttribute(Qt::WA_NoMouseReplay);
            menu->hide();
        }
    } else {
        d->setCurrentAction(action, true);
    }
}